

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

int __thiscall NodeBTree::lessThanKeyCompareOp(NodeBTree *this,KeyType *key,uint8_t *data)

{
  uint32_t uVar1;
  uint64_t uVar2;
  NodeKey *in_RSI;
  uint32_t nodeIndex;
  uint8_t *local_20;
  NodeKey *local_18;
  int local_4;
  
  local_18 = in_RSI;
  uVar2 = decodeBitsAndAdvance(&local_20);
  uVar1 = NodeKey::nodeIndex(local_18);
  if (uVar1 < (uint)uVar2) {
    local_4 = -1;
  }
  else {
    uVar1 = NodeKey::nodeIndex(local_18);
    if ((uint)uVar2 < uVar1) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int lessThanKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto nodeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		if (key.nodeIndex() < nodeIndex)
			return -1;
		else if (key.nodeIndex() > nodeIndex)
			return 1;
		else
			UNREACHABLE_CODE(0xDEAD);
	}